

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O0

void __thiscall
agge::tests::LayoutTests::NextWordIsDisplayedWithoutSpacesOnWordBreakWhenNextWordIsNotFound
          (LayoutTests *this)

{
  wrap limiter;
  element_type *font_factory_;
  glyph *local_4a8;
  allocator local_461;
  string local_460;
  LocationInfo local_440;
  text_line *local_418;
  text_line *local_410;
  vector<agge::text_line,_std::allocator<agge::text_line>_> local_408;
  int local_3ec [5];
  vector<int,_std::allocator<int>_> local_3d8;
  vector<int,_std::allocator<int>_> local_3c0;
  vector<int,_std::allocator<int>_> local_3a8;
  vector<int,_std::allocator<int>_> local_390;
  vector<int,_std::allocator<int>_> local_378;
  undefined1 local_360 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_318;
  ref_text_line local_300;
  int local_2d4 [5];
  vector<int,_std::allocator<int>_> local_2c0;
  vector<int,_std::allocator<int>_> local_2a8;
  vector<int,_std::allocator<int>_> local_290;
  vector<int,_std::allocator<int>_> local_278;
  vector<int,_std::allocator<int>_> local_260;
  undefined1 local_248 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_200;
  ref_text_line local_1e8;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_1c0;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_1a8;
  wrap local_190;
  allocator local_171;
  string local_170;
  richtext_t local_150;
  undefined1 local_e8 [8];
  layout l;
  undefined1 local_88 [8];
  factory_ptr f;
  glyph glyphs [2];
  char_to_index indices [2];
  LayoutTests *this_local;
  
  glyphs[1].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x100000041;
  f.super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4010000000000000;
  glyphs[0].metrics.dx = 0.0;
  glyphs[0].metrics.dy = 0.0;
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[0].metrics.dy);
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4014000000000000;
  glyphs[1].metrics.dx = 0.0;
  glyphs[1].metrics.dy = 0.0;
  glyphs[1].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[1].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[1].metrics.dy);
  create_single_font_factory<2ul,2ul>
            ((LayoutTests *)local_88,(font_metrics *)this,
             (char_to_index (*) [2])(anonymous_namespace)::c_fm1,
             (glyph (*) [2])
             &glyphs[1].outline.
              super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  layout::layout((layout *)local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"AAAAA   A   A",&local_171);
  R(&local_150,&local_170);
  limit::wrap::wrap(&local_190,26.0);
  font_factory_ =
       std::
       __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
       ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_88);
  limiter._eow.next = local_190._eow.next;
  limiter._sow.extent = local_190._sow.extent;
  limiter._limit = local_190._limit;
  limiter._eow.extent = local_190._eow.extent;
  limiter._sow.next = local_190._sow.next;
  limiter._previous_space = local_190._previous_space;
  limiter._21_3_ = local_190._21_3_;
  layout::process<agge::limit::wrap,agge::tests::LayoutTests::font_factory>
            ((layout *)local_e8,&local_150,limiter,font_factory_);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)local_88);
  font_factory::operator*((font_factory *)local_248);
  local_2d4[4] = 1;
  plural_::operator+(&local_2c0,(plural_ *)&plural,local_2d4 + 4);
  local_2d4[3] = 1;
  tests::operator+(&local_2a8,&local_2c0,local_2d4 + 3);
  local_2d4[2] = 1;
  tests::operator+(&local_290,&local_2a8,local_2d4 + 2);
  local_2d4[1] = 1;
  tests::operator+(&local_278,&local_290,local_2d4 + 1);
  local_2d4[0] = 1;
  tests::operator+(&local_260,&local_278,local_2d4);
  ref_glyph_run::ref_glyph_run<int>
            ((ref_glyph_run *)(local_248 + 0x10),(shared_ptr<agge::font> *)local_248,0.0,0.0,
             &local_260);
  plural_::operator+(&local_200,(plural_ *)&plural,(ref_glyph_run *)(local_248 + 0x10));
  ref_text_line::ref_text_line(&local_1e8,0.0,10.0,0.0,&local_200);
  plural_::operator+(&local_1c0,(plural_ *)&plural,&local_1e8);
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)local_88);
  font_factory::operator*((font_factory *)local_360);
  local_3ec[4] = 1;
  plural_::operator+(&local_3d8,(plural_ *)&plural,local_3ec + 4);
  local_3ec[3] = 0;
  tests::operator+(&local_3c0,&local_3d8,local_3ec + 3);
  local_3ec[2] = 0;
  tests::operator+(&local_3a8,&local_3c0,local_3ec + 2);
  local_3ec[1] = 0;
  tests::operator+(&local_390,&local_3a8,local_3ec + 1);
  local_3ec[0] = 1;
  tests::operator+(&local_378,&local_390,local_3ec);
  ref_glyph_run::ref_glyph_run<int>
            ((ref_glyph_run *)(local_360 + 0x10),(shared_ptr<agge::font> *)local_360,0.0,0.0,
             &local_378);
  plural_::operator+(&local_318,(plural_ *)&plural,(ref_glyph_run *)(local_360 + 0x10));
  ref_text_line::ref_text_line(&local_300,0.0,24.0,0.0,&local_318);
  tests::operator+(&local_1a8,&local_1c0,&local_300);
  local_410 = (text_line *)layout::begin((layout *)local_e8);
  local_418 = (text_line *)layout::end((layout *)local_e8);
  mkvector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>>
            (&local_408,(tests *)local_410,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_418,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_190._16_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_460,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_461);
  ut::LocationInfo::LocationInfo(&local_440,&local_460,0x216);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_1a8,&local_408,&local_440);
  ut::LocationInfo::~LocationInfo(&local_440);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  std::vector<agge::text_line,_std::allocator<agge::text_line>_>::~vector(&local_408);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_1a8);
  ref_text_line::~ref_text_line(&local_300);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_318);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_360 + 0x10));
  std::vector<int,_std::allocator<int>_>::~vector(&local_378);
  std::vector<int,_std::allocator<int>_>::~vector(&local_390);
  std::vector<int,_std::allocator<int>_>::~vector(&local_3a8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_3c0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_3d8);
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_360);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_1c0);
  ref_text_line::~ref_text_line(&local_1e8);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_200);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_248 + 0x10));
  std::vector<int,_std::allocator<int>_>::~vector(&local_260);
  std::vector<int,_std::allocator<int>_>::~vector(&local_278);
  std::vector<int,_std::allocator<int>_>::~vector(&local_290);
  std::vector<int,_std::allocator<int>_>::~vector(&local_2a8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_2c0);
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_248);
  layout::~layout((layout *)local_e8);
  std::shared_ptr<agge::tests::LayoutTests::font_factory>::~shared_ptr
            ((shared_ptr<agge::tests::LayoutTests::font_factory> *)local_88);
  local_4a8 = (glyph *)&glyphs[1].outline.
                        super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    local_4a8 = local_4a8 + -1;
    mocks::font_accessor::glyph::~glyph(local_4a8);
  } while (local_4a8 !=
           (glyph *)&f.
                     super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount);
  return;
}

Assistant:

test( NextWordIsDisplayedWithoutSpacesOnWordBreakWhenNextWordIsNotFound )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = { { L'A', 1 }, { L' ', 0 }, };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 4, 0 } },
					{ { 5, 0 } },
				};
				factory_ptr f = create_single_font_factory(c_fm1, indices, glyphs);
				layout l;

				// ACT
				l.process(R("AAAAA   A   A"), limit::wrap(26.0f), *f);

				// ASSERT
				assert_equal(plural
					+ ref_text_line(0.0f, 10.0f, 0.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 1 + 1 + 1 + 1 + 1))
					+ ref_text_line(0.0f, 24.0f, 0.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 1 + 0 + 0 + 0 + 1)),
					mkvector(l.begin(), l.end()));
			}